

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_linux_alsa.c
# Opt level: O2

PaError AlsaStop(PaAlsaStream *stream,int abort)

{
  snd_pcm_t *psVar1;
  int iVar2;
  int iVar3;
  pthread_t pVar4;
  char *errorText;
  undefined4 in_register_00000034;
  char *format;
  
  psVar1 = (stream->playback).pcm;
  if ((psVar1 == (snd_pcm_t *)0x0) ||
     (iVar2 = snd_pcm_drop(psVar1,CONCAT44(in_register_00000034,abort)), -1 < iVar2)) {
    if ((stream->capture).pcm == (snd_pcm_t *)0x0) {
      return 0;
    }
    if (stream->pcmsSynced != 0) {
      return 0;
    }
    iVar2 = snd_pcm_drop();
    if (-1 < iVar2) {
      return 0;
    }
    pVar4 = pthread_self();
    iVar3 = pthread_equal(pVar4,paUnixMainThread);
    format = 
    "Expression \'alsa_snd_pcm_drop( stream->capture.pcm )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_1510/jitsi[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 3108\n"
    ;
  }
  else {
    pVar4 = pthread_self();
    iVar3 = pthread_equal(pVar4,paUnixMainThread);
    format = 
    "Expression \'alsa_snd_pcm_drop( stream->playback.pcm )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_1510/jitsi[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 3104\n"
    ;
  }
  if (iVar3 != 0) {
    errorText = (char *)snd_strerror(iVar2);
    PaUtil_SetLastHostErrorInfo(paALSA,(long)iVar2,errorText);
  }
  PaUtil_DebugPrint(format);
  return -9999;
}

Assistant:

static PaError AlsaStop( PaAlsaStream *stream, int abort )
{
    PaError result = paNoError;
    /* XXX: alsa_snd_pcm_drain tends to lock up, avoid it until we find out more */
    abort = 1;
    /*
    if( stream->capture.pcm && !strcmp( Pa_GetDeviceInfo( stream->capture.device )->name,
                "dmix" ) )
    {
        abort = 1;
    }
    else if( stream->playback.pcm && !strcmp( Pa_GetDeviceInfo( stream->playback.device )->name,
                "dmix" ) )
    {
        abort = 1;
    }
    */

    if( abort )
    {
        if( stream->playback.pcm )
        {
            ENSURE_( alsa_snd_pcm_drop( stream->playback.pcm ), paUnanticipatedHostError );
        }
        if( stream->capture.pcm && !stream->pcmsSynced )
        {
            ENSURE_( alsa_snd_pcm_drop( stream->capture.pcm ), paUnanticipatedHostError );
        }

        PA_DEBUG(( "%s: Dropped frames\n", __FUNCTION__ ));
    }
    else
    {
        if( stream->playback.pcm )
        {
            ENSURE_( alsa_snd_pcm_nonblock( stream->playback.pcm, 0 ), paUnanticipatedHostError );
            if( alsa_snd_pcm_drain( stream->playback.pcm ) < 0 )
            {
                PA_DEBUG(( "%s: Draining playback handle failed!\n", __FUNCTION__ ));
            }
        }
        if( stream->capture.pcm && !stream->pcmsSynced )
        {
            /* We don't need to retrieve any remaining frames */
            if( alsa_snd_pcm_drain( stream->capture.pcm ) < 0 )
            {
                PA_DEBUG(( "%s: Draining capture handle failed!\n", __FUNCTION__ ));
            }
        }
    }

end:
    return result;
error:
    goto end;
}